

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::merge
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          data_node_type *leaf,int key)

{
  longlong *plVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  uint8_t uVar4;
  byte bVar5;
  self_type *psVar6;
  model_node_type *pmVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  self_type **ppsVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int i;
  long lVar17;
  long lVar18;
  self_type *psVar19;
  data_node_type *leaf_00;
  model_node_type *node;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  traversal_path;
  TraversalNode local_40;
  
  traversal_path.
  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  traversal_path.
  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  traversal_path.
  super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.node = this->superroot_;
  local_40.bucketID = 0;
  std::
  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
  ::
  emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              *)&traversal_path,&local_40);
  leaf_00 = (data_node_type *)this->root_node_;
  if ((leaf_00->super_AlexNode<int,_int>).is_leaf_ == false) {
    do {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (leaf_00->super_AlexNode<int,_int>).model_.a_;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (double)key;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (leaf_00->super_AlexNode<int,_int>).model_.b_;
      auVar3 = vfmadd213sd_fma(auVar20,auVar22,auVar3);
      uVar14 = *(int *)&leaf_00->allocator_ - 1;
      dVar21 = auVar3._0_8_;
      uVar9 = ~((int)dVar21 >> 0x1f) & (int)dVar21;
      if ((int)uVar9 <= (int)uVar14) {
        uVar14 = uVar9;
      }
      local_40.node = (model_node_type *)leaf_00;
      local_40.bucketID = uVar14;
      std::
      vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
      ::
      emplace_back<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                  *)&traversal_path,&local_40);
      leaf_00 = (data_node_type *)
                (&(leaf_00->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar14];
    } while ((leaf_00->super_AlexNode<int,_int>).is_leaf_ != true);
    plVar1 = &(this->stats_).num_node_lookups;
    *plVar1 = *plVar1 + (long)(leaf_00->super_AlexNode<int,_int>).level_;
    auVar3 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar21 + 0.5)));
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar21 - auVar3._0_8_;
    auVar20 = vandpd_avx512vl(auVar23,auVar8);
    if (auVar20._0_8_ <= dVar21 * 2.220446049250313e-15) {
      if (auVar3._0_8_ <= dVar21) {
        if ((leaf_00->prev_leaf_ ==
             (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)0x0) ||
           (iVar10 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                     ::last_key(leaf_00->prev_leaf_), iVar10 < key)) goto LAB_0010cbeb;
        correct_traversal_path(this,leaf_00,&traversal_path,true);
        ppsVar11 = &leaf_00->prev_leaf_;
      }
      else {
        if ((leaf_00->next_leaf_ ==
             (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)0x0) ||
           (iVar10 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                     ::first_key(leaf_00->next_leaf_), key < iVar10)) goto LAB_0010cbeb;
        correct_traversal_path(this,leaf_00,&traversal_path,false);
        ppsVar11 = &leaf_00->next_leaf_;
      }
      leaf_00 = *ppsVar11;
    }
  }
LAB_0010cbeb:
  if (leaf_00 != leaf) {
    if ((leaf_00->prev_leaf_ != leaf) && (leaf_00->next_leaf_ != leaf)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                    ,0x8ca,
                    "void alex::Alex<int, int>::merge(data_node_type *, T) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    correct_traversal_path(this,leaf,&traversal_path,leaf_00->prev_leaf_ == leaf);
  }
  if ((long)traversal_path.
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)traversal_path.
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    lVar16 = ((long)traversal_path.
                    super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)traversal_path.
                   super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                   ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >> 0x20;
    node = traversal_path.
           super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar16].node;
    iVar10 = traversal_path.
             super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16].bucketID;
    iVar15 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
    while (-1 < lVar16) {
      while ((leaf->num_keys_ == 0 && (iVar15 < node->num_children_))) {
        iVar12 = iVar10 % iVar15;
        iVar13 = iVar10 % (iVar15 * 2);
        lVar17 = (long)(iVar10 - iVar12);
        lVar18 = (long)((iVar10 - iVar12) + iVar15);
        if (iVar13 == iVar12) {
          psVar19 = (self_type *)node->children_[lVar18];
          if ((psVar19->super_AlexNode<int,_int>).is_leaf_ == false) break;
        }
        else {
          psVar19 = (self_type *)node->children_[lVar17 + -1];
          if ((psVar19->super_AlexNode<int,_int>).is_leaf_ != true) break;
        }
        uVar4 = (leaf->super_AlexNode<int,_int>).duplication_factor_;
        if (uVar4 != (psVar19->super_AlexNode<int,_int>).duplication_factor_) break;
        for (; lVar17 < lVar18; lVar17 = lVar17 + 1) {
          node->children_[lVar17] = &psVar19->super_AlexNode<int,_int>;
        }
        if (iVar13 == iVar12) {
          psVar6 = leaf->prev_leaf_;
          psVar19->prev_leaf_ = psVar6;
          if (psVar6 != (self_type *)0x0) {
            ppsVar11 = &psVar6->next_leaf_;
LAB_0010cd13:
            *ppsVar11 = psVar19;
          }
        }
        else {
          psVar6 = leaf->next_leaf_;
          psVar19->next_leaf_ = psVar6;
          if (psVar6 != (self_type *)0x0) {
            ppsVar11 = &psVar6->prev_leaf_;
            goto LAB_0010cd13;
          }
        }
        (psVar19->super_AlexNode<int,_int>).duplication_factor_ = uVar4 + '\x01';
        delete_node(this,&leaf->super_AlexNode<int,_int>);
        piVar2 = &(this->stats_).num_data_nodes;
        *piVar2 = *piVar2 + -1;
        leaf = psVar19;
        iVar15 = 1 << ((psVar19->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
      }
      if (iVar15 != node->num_children_) break;
      bVar5 = (node->super_AlexNode<int,_int>).duplication_factor_;
      (leaf->super_AlexNode<int,_int>).duplication_factor_ = bVar5;
      pmVar7 = (model_node_type *)this->root_node_;
      delete_node(this,&node->super_AlexNode<int,_int>);
      piVar2 = &(this->stats_).num_model_nodes;
      *piVar2 = *piVar2 + -1;
      if (node == pmVar7) {
        this->root_node_ = &leaf->super_AlexNode<int,_int>;
        update_superroot_pointer(this);
        break;
      }
      iVar15 = 1 << (bVar5 & 0x1f);
      lVar16 = lVar16 + -1;
      iVar10 = traversal_path.
               super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].bucketID;
      node = traversal_path.
             super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16].node;
      iVar12 = iVar10 - iVar10 % iVar15;
      for (lVar17 = (long)iVar12; lVar17 < iVar12 + iVar15; lVar17 = lVar17 + 1) {
        node->children_[lVar17] = &leaf->super_AlexNode<int,_int>;
      }
    }
  }
  std::
  _Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  ::~_Vector_base(&traversal_path.
                   super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                 );
  return;
}

Assistant:

void merge(data_node_type* leaf, T key) {
    // first save the complete path down to data node
    std::vector<TraversalNode> traversal_path;
    auto leaf_dup = get_leaf(key, &traversal_path);
    // We might need to correct the traversal path in edge cases
    if (leaf_dup != leaf) {
      if (leaf_dup->prev_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, true);
      } else if (leaf_dup->next_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, false);
      } else {
        assert(false);
        return;
      }
    }
    if (traversal_path.size() == 1) {
      return;
    }
    int path_pos = static_cast<int>(traversal_path.size()) - 1;
    TraversalNode tn = traversal_path[path_pos];
    model_node_type* parent = tn.node;
    int bucketID = tn.bucketID;
    int repeats = 1 << leaf->duplication_factor_;

    while (path_pos >= 0) {
      // repeatedly merge leaf with "sibling" leaf by redirecting pointers in
      // the parent
      while (leaf->num_keys_ == 0 && repeats < parent->num_children_) {
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        // determine if the potential sibling leaf is adjacent to the right or
        // left
        bool adjacent_to_right =
            (bucketID % (repeats << 1) == bucketID % repeats);
        data_node_type* adjacent_leaf = nullptr;

        // check if adjacent node is a leaf
        if (adjacent_to_right && parent->children_[end_bucketID]->is_leaf_) {
          adjacent_leaf =
              static_cast<data_node_type*>(parent->children_[end_bucketID]);
        } else if (!adjacent_to_right &&
                   parent->children_[start_bucketID - 1]->is_leaf_) {
          adjacent_leaf = static_cast<data_node_type*>(
              parent->children_[start_bucketID - 1]);
        } else {
          break;  // unable to merge with sibling leaf
        }

        // check if adjacent node is a sibling
        if (leaf->duplication_factor_ != adjacent_leaf->duplication_factor_) {
          break;  // unable to merge with sibling leaf
        }

        // merge with adjacent leaf
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = adjacent_leaf;
        }
        if (adjacent_to_right) {
          adjacent_leaf->prev_leaf_ = leaf->prev_leaf_;
          if (leaf->prev_leaf_) {
            leaf->prev_leaf_->next_leaf_ = adjacent_leaf;
          }
        } else {
          adjacent_leaf->next_leaf_ = leaf->next_leaf_;
          if (leaf->next_leaf_) {
            leaf->next_leaf_->prev_leaf_ = adjacent_leaf;
          }
        }
        adjacent_leaf->duplication_factor_++;
        delete_node(leaf);
        stats_.num_data_nodes--;
        leaf = adjacent_leaf;
        repeats = 1 << leaf->duplication_factor_;
      }

      // try to merge up by removing parent and replacing pointers to parent
      // with pointers to leaf in grandparent
      if (repeats == parent->num_children_) {
        leaf->duplication_factor_ = parent->duplication_factor_;
        repeats = 1 << leaf->duplication_factor_;
        bool is_root_node = (parent == root_node_);
        delete_node(parent);
        stats_.num_model_nodes--;

        if (is_root_node) {
          root_node_ = leaf;
          update_superroot_pointer();
          break;
        }

        path_pos--;
        tn = traversal_path[path_pos];
        parent = tn.node;
        bucketID = tn.bucketID;
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = leaf;
        }
      } else {
        break;  // unable to merge up
      }
    }
  }